

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtUtil.c
# Opt level: O2

int Rwt_ManNodeVolume(Rwt_Man_t *p,Rwt_Node_t *p0,Rwt_Node_t *p1)

{
  uint in_EAX;
  int Volume;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  Rwt_ManIncTravId(p);
  Rwt_Trav_rec(p,p0,(int *)((long)&uStack_28 + 4));
  Rwt_Trav_rec(p,p1,(int *)((long)&uStack_28 + 4));
  return uStack_28._4_4_;
}

Assistant:

int Rwt_ManNodeVolume( Rwt_Man_t * p, Rwt_Node_t * p0, Rwt_Node_t * p1 )
{
    int Volume = 0;
    Rwt_ManIncTravId( p );
    Rwt_Trav_rec( p, p0, &Volume );
    Rwt_Trav_rec( p, p1, &Volume );
    return Volume;
}